

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::MatchExpr<duckdb_interval,_Catch::Matchers::Generic::PredicateMatcher<duckdb_interval>_>::
MatchExpr(MatchExpr<duckdb_interval,_Catch::Matchers::Generic::PredicateMatcher<duckdb_interval>_>
          *this,duckdb_interval *arg,PredicateMatcher<duckdb_interval> *matcher,
         StringRef *matcherString)

{
  size_type sVar1;
  int iVar2;
  
  iVar2 = (*(matcher->super_MatcherBase<duckdb_interval>).super_MatcherUntypedBase.
            _vptr_MatcherUntypedBase[3])(matcher);
  (this->super_ITransientExpression).m_isBinaryExpression = true;
  (this->super_ITransientExpression).m_result = SUB41(iVar2,0);
  (this->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_00570c50;
  this->m_arg = arg;
  Matchers::Generic::PredicateMatcher<duckdb_interval>::PredicateMatcher(&this->m_matcher,matcher);
  sVar1 = matcherString->m_size;
  (this->m_matcherString).m_start = matcherString->m_start;
  (this->m_matcherString).m_size = sVar1;
  return;
}

Assistant:

MatchExpr( ArgT const& arg, MatcherT const& matcher, StringRef const& matcherString )
        :   ITransientExpression{ true, matcher.match( arg ) },
            m_arg( arg ),
            m_matcher( matcher ),
            m_matcherString( matcherString )
        {}